

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dimension_holders.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_down
          (Matrix_all_dimension_holder<int> *this,uint dimension)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  bool bVar4;
  uint dimension_local;
  Matrix_all_dimension_holder<int> *this_local;
  
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->dimensions_,(ulong)dimension);
  *pvVar2 = *pvVar2 - 1;
  while( true ) {
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->dimensions_);
    bVar4 = false;
    if (!bVar1) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&this->dimensions_);
      bVar4 = *pvVar2 == 0;
    }
    if (!bVar4) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&this->dimensions_);
  }
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->dimensions_);
  this->maxDim_ = (int)sVar3 + -1;
  return;
}

Assistant:

void update_down(unsigned int dimension) {
    --(dimensions_[dimension]);  // assumes dimension already exists and is not 0
    while (!dimensions_.empty() && dimensions_.back() == 0) dimensions_.pop_back();
    maxDim_ = dimensions_.size() - 1;
  }